

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

dropt_char * dropt_get_error_message(dropt_context *context)

{
  dropt_error error;
  dropt_char *optionName;
  dropt_char *optionArgument;
  char *pcVar1;
  char *pcVar2;
  
  if (context != (dropt_context *)0x0) {
    error = (context->errorDetails).err;
    if (error == 0) {
      pcVar2 = "";
    }
    else {
      pcVar1 = (context->errorDetails).message;
      if (pcVar1 == (char *)0x0) {
        optionName = (context->errorDetails).optionName;
        optionArgument = (context->errorDetails).optionArgument;
        if (context->errorHandler == (dropt_error_handler_func)0x0) {
          pcVar1 = dropt_default_error_handler(error,optionName,optionArgument);
        }
        else {
          pcVar1 = (*context->errorHandler)
                             (error,optionName,optionArgument,context->errorHandlerData);
        }
        (context->errorDetails).message = pcVar1;
      }
      pcVar2 = "Unknown error";
      if (pcVar1 != (char *)0x0) {
        pcVar2 = pcVar1;
      }
    }
    return pcVar2;
  }
  dropt_misuse("No dropt context specified.",
               "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
               0x292);
}

Assistant:

const dropt_char*
dropt_get_error_message(dropt_context* context)
{
    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.err == dropt_error_none)
    {
        return DROPT_TEXT_LITERAL("");
    }

    if (context->errorDetails.message == NULL)
    {
        if (context->errorHandler != NULL)
        {
            context->errorDetails.message
                = context->errorHandler(context->errorDetails.err,
                                        context->errorDetails.optionName,
                                        context->errorDetails.optionArgument,
                                        context->errorHandlerData);
        }
        else
        {
#ifndef DROPT_NO_STRING_BUFFERS
            context->errorDetails.message
                = dropt_default_error_handler(context->errorDetails.err,
                                              context->errorDetails.optionName,
                                              context->errorDetails.optionArgument);
#endif
        }
    }

    return (context->errorDetails.message == NULL)
           ? DROPT_TEXT_LITERAL("Unknown error")
           : context->errorDetails.message;
}